

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

SiameseResult __thiscall
siamese::Encoder::GenerateCauchyPacket(Encoder *this,SiameseRecoveryPacket *packet)

{
  GrowingAlignedDataBuffer *this_00;
  uint uVar1;
  ostringstream *this_01;
  EncoderSubwindow *pEVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  SiameseResult SVar8;
  uint8_t *puVar9;
  OutputWorker *this_02;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong __n;
  uint uVar15;
  uint uVar16;
  uint local_1e0;
  LogStringBuffer local_1b8;
  
  uVar14 = (this->Window).LongestPacket;
  uVar15 = (this->Window).FirstUnremovedElement;
  this_00 = &this->RecoveryPacket;
  bVar6 = GrowingAlignedDataBuffer::Initialize(this_00,&this->TheAllocator,uVar14 + 8);
  if (bVar6) {
    uVar10 = (this->Window).ColumnStart;
    uVar12 = (this->Window).Count - (this->Window).FirstUnremovedElement;
    uVar1 = uVar15 + uVar10;
    uVar10 = this->NextParityColumn - uVar10 & 0x3fffff;
    if (uVar15 < uVar10 && uVar10 < 0x200000) {
      uVar10 = this->NextCauchyRow;
      local_1e0 = uVar10 + 1;
      uVar7 = local_1e0;
      if (0xbf < local_1e0) {
        uVar7 = 0;
      }
      uVar16 = uVar1 & 0x3f;
      this->NextCauchyRow = uVar7;
      uVar7 = uVar10 + 0x40 & 0xff;
      pEVar2 = (this->Window).Subwindows.DataPtr[uVar15 >> 6];
      uVar10 = (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Bytes;
      __n = (ulong)uVar10;
      gf256_mul_mem((this->RecoveryPacket).Data,
                    (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Data,
                    GF256Ctx.GF256_INV_TABLE[uVar7 ^ uVar16],uVar10);
      memset((this->RecoveryPacket).Data + __n,0,(ulong)(uVar14 - uVar10));
      uVar14 = (this->Window).Count;
      while (uVar15 = uVar15 + 1, uVar15 < uVar14) {
        uVar16 = uVar16 + 1 & 0x3f;
        pEVar2 = (this->Window).Subwindows.DataPtr[uVar15 >> 6];
        uVar10 = (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Bytes;
        gf256_muladd_mem((this->RecoveryPacket).Data,GF256Ctx.GF256_INV_TABLE[uVar16 ^ uVar7],
                         (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Data,uVar10);
        if ((uint)__n <= uVar10) {
          __n = (ulong)uVar10;
        }
      }
    }
    else {
      this->NextParityColumn = uVar1 + uVar12 & 0x3fffff;
      pEVar2 = (this->Window).Subwindows.DataPtr[uVar15 >> 6];
      uVar10 = (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Bytes;
      __n = (ulong)uVar10;
      memcpy((this->RecoveryPacket).Data,(pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Data,__n
            );
      local_1e0 = 0;
      memset((this->RecoveryPacket).Data + __n,0,(ulong)(uVar14 - uVar10));
      uVar14 = (this->Window).Count;
      while (uVar15 = uVar15 + 1, uVar15 < uVar14) {
        pEVar2 = (this->Window).Subwindows.DataPtr[uVar15 >> 6];
        uVar10 = (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Bytes;
        gf256_add_mem((this->RecoveryPacket).Data,
                      (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Data,uVar10);
        if ((uint)__n <= uVar10) {
          __n = (ulong)uVar10;
        }
      }
    }
    uVar14 = 0;
    puVar9 = this_00->Data + __n;
    if (1 < uVar12) {
      *puVar9 = (uint8_t)local_1e0;
      puVar9[1] = (uint8_t)uVar12;
      if (uVar12 < 0x80) {
        uVar14 = 2;
      }
      else {
        puVar9[2] = (byte)(uVar12 >> 8) | 0x80;
        uVar14 = 3;
      }
    }
    uVar11 = (ulong)uVar14;
    if ((uVar1 & 0x3fffff) < 0x80) {
      puVar9[uVar11] = (uint8_t)uVar1;
      uVar14 = 1;
    }
    else {
      bVar4 = (byte)(uVar1 >> 8);
      puVar9[uVar11] = (uint8_t)uVar1;
      if ((uVar1 & 0x3fffff) < 0x4000) {
        uVar14 = 2;
        puVar9[uVar11 + 1] = bVar4 | 0x80;
      }
      else {
        uVar14 = 3;
        puVar9[uVar11 + 1] = bVar4;
        puVar9[uVar11 + 2] = (byte)(uVar1 >> 0x10) | 0xc0;
      }
    }
    lVar13 = uVar14 + uVar11;
    uVar12 = uVar12 - 1;
    if (uVar12 < 0x80) {
      iVar5 = 1;
    }
    else {
      puVar9[lVar13 + 1] = (byte)(uVar12 >> 8) | 0x80;
      iVar5 = 2;
    }
    puVar9[lVar13] = (uint8_t)uVar12;
    uVar14 = (int)__n + (int)lVar13 + iVar5;
    packet->Data = this_00->Data;
    packet->DataBytes = uVar14;
    if (DAT_0019e278 < 3) {
      this_01 = &local_1b8.LogStream;
      local_1b8.ChannelName = Logger;
      local_1b8.LogLevel = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      std::operator<<((ostream *)this_01,(string *)&DAT_0019e2a8);
      std::operator<<((ostream *)this_01,"Generated Cauchy/parity recovery packet start=");
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      std::operator<<((ostream *)this_01," ldpcCount=");
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      std::operator<<((ostream *)this_01," sumCount=");
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      std::operator<<((ostream *)this_01," row=");
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      this_02 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_02,&local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      uVar14 = packet->DataBytes;
    }
    auVar3 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar3 = vpinsrq_avx(auVar3,(ulong)uVar14,1);
    auVar3 = vpaddq_avx(auVar3,*(undefined1 (*) [16])((this->Stats).Counts + 2));
    SVar8 = Siamese_Success;
    *(undefined1 (*) [16])((this->Stats).Counts + 2) = auVar3;
  }
  else {
    (this->Window).EmergencyDisabled = true;
    SVar8 = Siamese_Disabled;
  }
  return SVar8;
}

Assistant:

SiameseResult Encoder::GenerateCauchyPacket(SiameseRecoveryPacket& packet)
{
    // Reset recovery packet
    const unsigned firstElement  = Window.FirstUnremovedElement;
    const unsigned recoveryBytes = Window.LongestPacket;
    if (!RecoveryPacket.Initialize(&TheAllocator, recoveryBytes + kMaxRecoveryMetadataBytes))
    {
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }

    const unsigned unacknowledgedCount = Window.GetUnacknowledgedCount();
    RecoveryMetadata metadata;
    metadata.SumCount    = unacknowledgedCount;
    metadata.LDPCCount   = unacknowledgedCount;
    metadata.ColumnStart = Window.ElementToColumn(firstElement);

    // We have to recalculate the number of used bytes since the Cauchy/parity rows may be
    // shorter since they do not need to contain the start of the window which may be acked.
    unsigned usedBytes = 0;

    // If it is time to generate a new parity row:
    const unsigned nextParityElement = Window.ColumnToElement(NextParityColumn);
    if (nextParityElement <= firstElement || IsColumnDeltaNegative(nextParityElement))
    {
        // Set next time we write a parity row
        NextParityColumn = AddColumns(metadata.ColumnStart, unacknowledgedCount);

        // Row 0 is a parity row
        metadata.Row = 0;

        // Unroll first column
        OriginalPacket* original = Window.GetWindowElement(firstElement);
        unsigned originalBytes   = original->Buffer.Bytes;

        memcpy(RecoveryPacket.Data, original->Buffer.Data, originalBytes);
        // Pad the rest out with zeros to avoid corruption
        SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);
        memset(RecoveryPacket.Data + originalBytes, 0, recoveryBytes - originalBytes);

        usedBytes = originalBytes;

        // For each remaining column:
        for (unsigned element = firstElement + 1, count = Window.Count; element < count; ++element)
        {
            original      = Window.GetWindowElement(element);
            originalBytes = original->Buffer.Bytes;

            SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);

            gf256_add_mem(RecoveryPacket.Data, original->Buffer.Data, originalBytes);

            if (usedBytes < originalBytes)
                usedBytes = originalBytes;
        }
    }
    else
    {
        // Select Cauchy row number
        const unsigned cauchyRow = NextCauchyRow;
        metadata.Row = cauchyRow + 1;
        if (++NextCauchyRow >= kCauchyMaxRows)
            NextCauchyRow = 0;

        // Unroll first column
        unsigned cauchyColumn    = metadata.ColumnStart % kCauchyMaxColumns;
        OriginalPacket* original = Window.GetWindowElement(firstElement);
        uint8_t y                = CauchyElement(cauchyRow, cauchyColumn);
        unsigned originalBytes   = original->Buffer.Bytes;

        gf256_mul_mem(RecoveryPacket.Data, original->Buffer.Data, y, originalBytes);
        // Pad the rest out with zeros to avoid corruption
        SIAMESE_DEBUG_ASSERT(recoveryBytes >= originalBytes);
        SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);
        memset(RecoveryPacket.Data + originalBytes, 0, recoveryBytes - originalBytes);

        usedBytes = originalBytes;

        // For each remaining column:
        for (unsigned element = firstElement + 1, count = Window.Count; element < count; ++element)
        {
            cauchyColumn  = (cauchyColumn + 1) % kCauchyMaxColumns;
            original      = Window.GetWindowElement(element);
            originalBytes = original->Buffer.Bytes;
            y             = CauchyElement(cauchyRow, cauchyColumn);

            SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);

            gf256_muladd_mem(RecoveryPacket.Data, y, original->Buffer.Data, originalBytes);

            if (usedBytes < originalBytes)
                usedBytes = originalBytes;
        }
    }

    // Slap metadata footer on the end
    const unsigned footerBytes = SerializeFooter_RecoveryMetadata(metadata, RecoveryPacket.Data + usedBytes);

    packet.Data      = RecoveryPacket.Data;
    packet.DataBytes = usedBytes + footerBytes;

    Logger.Info("Generated Cauchy/parity recovery packet start=", metadata.ColumnStart, " ldpcCount=", metadata.LDPCCount, " sumCount=", metadata.SumCount, " row=", metadata.Row);

    Stats.Counts[SiameseEncoderStats_RecoveryCount]++;
    Stats.Counts[SiameseEncoderStats_RecoveryBytes] += packet.DataBytes;

    return Siamese_Success;
}